

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestNetwork::TestNetwork(TestNetwork *this)

{
  SchemaType<capnproto_test::capnp::test::TestInterface> schema;
  SchemaType<capnproto_test::capnp::test::TestExtends> schema_00;
  SchemaType<capnproto_test::capnp::test::TestPipeline> schema_01;
  SchemaType<capnproto_test::capnp::test::TestCallOrder> schema_02;
  SchemaType<capnproto_test::capnp::test::TestTailCallee> schema_03;
  SchemaType<capnproto_test::capnp::test::TestTailCaller> schema_04;
  SchemaType<capnproto_test::capnp::test::TestMoreStuff> schema_05;
  TestNetwork *this_local;
  
  RpcDumper::RpcDumper(&this->dumper);
  std::
  map<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter>_>_>_>
  ::map(&this->map);
  schema = Schema::from<capnproto_test::capnp::test::TestInterface>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema.super_Schema.raw);
  schema_00 = Schema::from<capnproto_test::capnp::test::TestExtends>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema_00.super_Schema.raw);
  schema_01 = Schema::from<capnproto_test::capnp::test::TestPipeline>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema_01.super_Schema.raw);
  schema_02 = Schema::from<capnproto_test::capnp::test::TestCallOrder>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema_02.super_Schema.raw);
  schema_03 = Schema::from<capnproto_test::capnp::test::TestTailCallee>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema_03.super_Schema.raw);
  schema_04 = Schema::from<capnproto_test::capnp::test::TestTailCaller>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema_04.super_Schema.raw);
  schema_05 = Schema::from<capnproto_test::capnp::test::TestMoreStuff>();
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)schema_05.super_Schema.raw);
  return;
}

Assistant:

TestNetwork() {
    dumper.addSchema(Schema::from<test::TestInterface>());
    dumper.addSchema(Schema::from<test::TestExtends>());
    dumper.addSchema(Schema::from<test::TestPipeline>());
    dumper.addSchema(Schema::from<test::TestCallOrder>());
    dumper.addSchema(Schema::from<test::TestTailCallee>());
    dumper.addSchema(Schema::from<test::TestTailCaller>());
    dumper.addSchema(Schema::from<test::TestMoreStuff>());
  }